

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  int cc;
  int c;
  int n;
  int ci;
  int i;
  uint num_left;
  jpgd_status status;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_10;
  int local_c;
  
  uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe4);
  uVar2 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe4);
  *(uint *)(in_RDI + 0x1f8) = uVar2;
  local_c = uVar1 - 3;
  status = (jpgd_status)((ulong)in_RDI >> 0x20);
  if (((local_c == uVar2 * 2 + 3) && (0 < (int)uVar2)) && ((int)uVar2 < 5)) {
    local_10 = 0;
    while( true ) {
      if ((int)uVar2 <= local_10) {
        uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                         in_stack_ffffffffffffffe4);
        *(uint *)(in_RDI + 0x22c) = uVar1;
        uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                         in_stack_ffffffffffffffe4);
        *(uint *)(in_RDI + 0x230) = uVar1;
        uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                         in_stack_ffffffffffffffe4);
        *(uint *)(in_RDI + 0x238) = uVar1;
        uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                         in_stack_ffffffffffffffe4);
        *(uint *)(in_RDI + 0x234) = uVar1;
        if (*(int *)(in_RDI + 0xe0) == 0) {
          *(undefined4 *)(in_RDI + 0x22c) = 0;
          *(undefined4 *)(in_RDI + 0x230) = 0x3f;
        }
        for (local_c = local_c + -3; local_c != 0; local_c = local_c + -1) {
          get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                   in_stack_ffffffffffffffe4);
        }
        return;
      }
      uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                       in_stack_ffffffffffffffe4);
      in_stack_ffffffffffffffe4 =
           get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,uVar2),
                    in_stack_ffffffffffffffe4);
      local_c = local_c + -2;
      in_stack_ffffffffffffffec = 0;
      while ((in_stack_ffffffffffffffec < *(int *)(in_RDI + 0x194) &&
             (uVar1 != *(uint *)(in_RDI + 0x1c8 + (long)in_stack_ffffffffffffffec * 4)))) {
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1;
      }
      if (*(int *)(in_RDI + 0x194) <= in_stack_ffffffffffffffec) break;
      *(int *)(in_RDI + 0x1fc + (long)local_10 * 4) = in_stack_ffffffffffffffec;
      *(uint *)(in_RDI + 0x20c + (long)in_stack_ffffffffffffffec * 4) =
           (int)in_stack_ffffffffffffffe4 >> 4 & 0xf;
      *(uint *)(in_RDI + 0x21c + (long)in_stack_ffffffffffffffec * 4) =
           (in_stack_ffffffffffffffe4 & 0xf) + 4;
      local_10 = local_10 + 1;
    }
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffe4,uVar1),status);
  }
  stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),status
               );
}

Assistant:

void jpeg_decoder::read_sos_marker() {
  uint num_left;
  int i, ci, n, c, cc;

  num_left = get_bits(16);

  n = get_bits(8);

  m_comps_in_scan = n;

  num_left -= 3;

  if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
    stop_decoding(JPGD_BAD_SOS_LENGTH);

  for (i = 0; i < n; i++) {
    cc = get_bits(8);
    c = get_bits(8);
    num_left -= 2;

    for (ci = 0; ci < m_comps_in_frame; ci++)
      if (cc == m_comp_ident[ci])
        break;

    if (ci >= m_comps_in_frame)
      stop_decoding(JPGD_BAD_SOS_COMP_ID);

    m_comp_list[i] = ci;
    m_comp_dc_tab[ci] = (c >> 4) & 15;
    m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);
  }

  m_spectral_start = get_bits(8);
  m_spectral_end = get_bits(8);
  m_successive_high = get_bits(4);
  m_successive_low = get_bits(4);

  if (!m_progressive_flag) {
    m_spectral_start = 0;
    m_spectral_end = 63;
  }

  num_left -= 3;

  while (num_left) /* read past whatever is num_left */
  {
    get_bits(8);
    num_left--;
  }
}